

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkSkeletonBlifMv(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  void *pvVar9;
  int nBits;
  int nValues;
  int v;
  int k;
  int i;
  Abc_Obj_t *pBoxNew;
  Abc_Obj_t *pTermNew;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNetNew;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  int fUsePositional;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2de,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkHasBlifMv(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasBlifMv(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2df,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkWhiteboxNum(pNtk);
  if (iVar1 != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2e0,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkBlackboxNum(pNtk);
  if (iVar1 != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2e1,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  Abc_NtkCleanCopy(pNtk);
  pNtk_local = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtk_local->pName = pcVar3;
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtk_local->pSpec = pcVar3;
  pAVar4 = Abc_NtkCreateWhitebox(pNtk_local);
  for (v = 0; iVar1 = Abc_NtkPiNum(pNtk), v < iVar1; v = v + 1) {
    pAVar5 = Abc_NtkPi(pNtk,v);
    Abc_NtkDupObj(pNtk_local,pAVar5,0);
    pAVar6 = Abc_ObjFanout0(pAVar5);
    Abc_NtkDupObj(pNtk_local,pAVar6,1);
    Abc_ObjAddFanin((pAVar6->field_6).pCopy,(pAVar5->field_6).pCopy);
  }
  for (v = 0; iVar1 = Abc_NtkPoNum(pNtk), v < iVar1; v = v + 1) {
    pAVar5 = Abc_NtkPo(pNtk,v);
    Abc_NtkDupObj(pNtk_local,pAVar5,0);
    pAVar6 = Abc_ObjFanin0(pAVar5);
    if ((pAVar6->field_6).pTemp == (void *)0x0) {
      Abc_NtkDupObj(pNtk_local,pAVar6,1);
    }
    Abc_ObjAddFanin((pAVar5->field_6).pCopy,(pAVar6->field_6).pCopy);
  }
  v = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vBoxes);
    if (iVar1 <= v) {
      Abc_NtkIncrementTravId(pNtk);
      for (v = 0; iVar1 = Abc_NtkCiNum(pNtk), v < iVar1; v = v + 1) {
        pAVar5 = Abc_NtkCi(pNtk,v);
        pAVar5 = Abc_ObjFanout0(pAVar5);
        uVar2 = Abc_ObjMvVarNum(pAVar5);
        iVar1 = Abc_Base2Log(uVar2);
        for (nValues = 0; nValues < iVar1; nValues = nValues + 1) {
          pAVar6 = Abc_NtkCreateNode(pNtk_local);
          pcVar3 = Abc_SopEncoderLog((Mem_Flex_t *)pNtk_local->pManFunc,nValues,uVar2);
          (pAVar6->field_5).pData = pcVar3;
          pAVar7 = Abc_NtkCreateNet(pNtk_local);
          pAVar8 = Abc_NtkCreateBi(pNtk_local);
          Abc_ObjAddFanin(pAVar6,(pAVar5->field_6).pCopy);
          Abc_ObjAddFanin(pAVar7,pAVar6);
          Abc_ObjAddFanin(pAVar8,pAVar7);
          Abc_ObjAddFanin(pAVar4,pAVar8);
        }
        Abc_NodeSetTravIdCurrent(pAVar5);
      }
      for (v = 0; iVar1 = Abc_NtkCoNum(pNtk), v < iVar1; v = v + 1) {
        pAVar5 = Abc_NtkCo(pNtk,v);
        pAVar5 = Abc_ObjFanin0(pAVar5);
        iVar1 = Abc_NodeIsTravIdCurrent(pAVar5);
        if (iVar1 == 0) {
          Abc_NodeSetTravIdCurrent(pAVar5);
          uVar2 = Abc_ObjMvVarNum(pAVar5);
          iVar1 = Abc_Base2Log(uVar2);
          pAVar6 = Abc_NtkCreateNode(pNtk_local);
          pcVar3 = Abc_SopDecoderLog((Mem_Flex_t *)pNtk_local->pManFunc,uVar2);
          (pAVar6->field_5).pData = pcVar3;
          for (nValues = 0; nValues < iVar1; nValues = nValues + 1) {
            pAVar7 = Abc_NtkCreateBo(pNtk_local);
            pAVar8 = Abc_NtkCreateNet(pNtk_local);
            Abc_ObjAddFanin(pAVar7,pAVar4);
            Abc_ObjAddFanin(pAVar8,pAVar7);
            Abc_ObjAddFanin(pAVar6,pAVar8);
          }
          Abc_ObjAddFanin((pAVar5->field_6).pCopy,pAVar6);
        }
      }
      iVar1 = Abc_NtkHasBlifMv(pNtk);
      if ((iVar1 != 0) && (pvVar9 = Abc_NtkMvVar(pNtk), pvVar9 != (void *)0x0)) {
        pvVar9 = Abc_NtkMvVar(pNtk_local);
        if (pvVar9 == (void *)0x0) {
          Abc_NtkStartMvVars(pNtk_local);
        }
        for (v = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), v < iVar1; v = v + 1) {
          pAVar4 = Abc_NtkObj(pNtk,v);
          if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNet(pAVar4), iVar1 != 0)) &&
             ((pAVar4->field_6).pTemp != (void *)0x0)) {
            pAVar5 = (pAVar4->field_6).pCopy;
            iVar1 = Abc_ObjMvVarNum(pAVar4);
            Abc_NtkSetMvVarValues(pAVar5,iVar1);
          }
        }
      }
      iVar1 = Abc_NtkCheck(pNtk_local);
      if (iVar1 == 0) {
        fprintf(_stdout,"Abc_NtkSkeletonBlifMv(): Network check has failed.\n");
        Abc_NtkDelete(pNtk_local);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      return pNtk_local;
    }
    pAVar5 = Abc_NtkBox(pNtk,v);
    iVar1 = Abc_ObjIsLatch(pAVar5);
    if (iVar1 != 0) {
      Abc_NtkDupBox(pNtk_local,pAVar5,0);
      pAVar6 = Abc_ObjFanout0(pAVar5);
      pAVar6 = Abc_ObjFanout0(pAVar6);
      if ((pAVar6->field_6).pTemp != (void *)0x0) {
        __assert_fail("pNet->pCopy == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                      ,0x304,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
      }
      Abc_NtkDupObj(pNtk_local,pAVar6,1);
      pAVar6 = (pAVar6->field_6).pCopy;
      pAVar7 = Abc_ObjFanout0(pAVar5);
      Abc_ObjAddFanin(pAVar6,(pAVar7->field_6).pCopy);
      pAVar6 = Abc_ObjFanin0(pAVar5);
      pAVar6 = Abc_ObjFanin0(pAVar6);
      if ((pAVar6->field_6).pTemp == (void *)0x0) {
        Abc_NtkDupObj(pNtk_local,pAVar6,1);
      }
      pAVar5 = Abc_ObjFanin0(pAVar5);
      Abc_ObjAddFanin((pAVar5->field_6).pCopy,(pAVar6->field_6).pCopy);
    }
    v = v + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkSkeletonBlifMv( Abc_Ntk_t * pNtk )
{
    int fUsePositional = 0;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pNet, * pNetNew, * pNodeNew, * pTermNew, * pBoxNew;
    int i, k, v, nValues, nBits;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkHasBlifMv(pNtk) );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtk->pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pName );
    // create the internal box (it is important to put it first!)
    pBoxNew = Abc_NtkCreateWhitebox( pNtkNew );
    // create PIs and their nets
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        pNet = Abc_ObjFanout0(pObj);
        Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( pNet->pCopy, pObj->pCopy );
    }
    // create POs and their nets
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        pNet = Abc_ObjFanin0(pObj);
        if ( pNet->pCopy == NULL )
            Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( pObj->pCopy, pNet->pCopy );
    }
    // create latches
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        Abc_NtkDupBox( pNtkNew, pObj, 0 );
        // latch outputs
        pNet = Abc_ObjFanout0(Abc_ObjFanout0(pObj));
        assert( pNet->pCopy == NULL );
        Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( pNet->pCopy, Abc_ObjFanout0(pObj)->pCopy );
        // latch inputs
        pNet = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        if ( pNet->pCopy == NULL )
            Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( Abc_ObjFanin0(pObj)->pCopy, pNet->pCopy );
    }

    // encode the CI nets
    Abc_NtkIncrementTravId( pNtk );
    if ( fUsePositional )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            for ( v = 0; v < nValues; v++ )
            {
                pNodeNew = Abc_NtkCreateNode( pNtkNew );
                pNodeNew->pData = Abc_SopEncoderPos( (Mem_Flex_t *)pNtkNew->pManFunc, v, nValues );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                pTermNew = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pNodeNew, pNet->pCopy );
                Abc_ObjAddFanin( pNetNew, pNodeNew );
                Abc_ObjAddFanin( pTermNew, pNetNew );
                Abc_ObjAddFanin( pBoxNew, pTermNew );
            }
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }
    else
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pNodeNew = Abc_NtkCreateNode( pNtkNew );
                pNodeNew->pData = Abc_SopEncoderLog( (Mem_Flex_t *)pNtkNew->pManFunc, k, nValues );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                pTermNew = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pNodeNew, pNet->pCopy );
                Abc_ObjAddFanin( pNetNew, pNodeNew );
                Abc_ObjAddFanin( pTermNew, pNetNew );
                Abc_ObjAddFanin( pBoxNew, pTermNew );
            }
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }

    // encode the CO nets
    if ( fUsePositional )
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
            if ( Abc_NodeIsTravIdCurrent(pNet) )
                continue;
            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Abc_SopDecoderPos( (Mem_Flex_t *)pNtkNew->pManFunc, nValues );
            for ( v = 0; v < nValues; v++ )
            {
                pTermNew = Abc_NtkCreateBo( pNtkNew );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                Abc_ObjAddFanin( pTermNew, pBoxNew );
                Abc_ObjAddFanin( pNetNew, pTermNew );
                Abc_ObjAddFanin( pNodeNew, pNetNew );
            }
            Abc_ObjAddFanin( pNet->pCopy, pNodeNew );
        }
    }
    else
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
            if ( Abc_NodeIsTravIdCurrent(pNet) )
                continue;
            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            nBits = Abc_Base2Log( nValues );
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Abc_SopDecoderLog( (Mem_Flex_t *)pNtkNew->pManFunc, nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pTermNew = Abc_NtkCreateBo( pNtkNew );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                Abc_ObjAddFanin( pTermNew, pBoxNew );
                Abc_ObjAddFanin( pNetNew, pTermNew );
                Abc_ObjAddFanin( pNodeNew, pNetNew );
            }
            Abc_ObjAddFanin( pNet->pCopy, pNodeNew );
        }
    }

    // if it is a BLIF-MV netlist transfer the values of all nets
    if ( Abc_NtkHasBlifMv(pNtk) && Abc_NtkMvVar(pNtk) )
    {
        if ( Abc_NtkMvVar( pNtkNew ) == NULL )
            Abc_NtkStartMvVars( pNtkNew );
        Abc_NtkForEachNet( pNtk, pObj, i )
            if ( pObj->pCopy )
                Abc_NtkSetMvVarValues( pObj->pCopy, Abc_ObjMvVarNum(pObj) );
    }

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkSkeletonBlifMv(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}